

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O3

base_learner * svrg_setup(options_i *options,vw *all)

{
  svrg *location;
  option_group_definition *this;
  typed_option<int> *op;
  learner<SVRG::svrg,_example> *plVar1;
  byte bVar2;
  uint32_t *puVar3;
  bool svrg_option;
  option_group_definition new_options;
  bool local_259;
  free_ptr<SVRG::svrg> local_258;
  string local_248;
  undefined1 *local_228 [2];
  undefined1 local_218 [16];
  string local_208;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  option_group_definition local_1c8;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  undefined1 local_170 [112];
  bool local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  typed_option<int> local_d0;
  
  location = calloc_or_throw<SVRG::svrg>(1);
  location->stage_size = 0;
  location->prev_pass = 0;
  *(undefined8 *)&location->stable_grad_count = 0;
  location->all = (vw *)0x0;
  local_258._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)destroy_free<SVRG::svrg>;
  local_259 = false;
  local_258._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.super__Head_base<0UL,_SVRG::svrg_*,_false>.
  _M_head_impl = location;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1e8,"Stochastic Variance Reduced Gradient","");
  local_1c8.m_name._M_dataplus._M_p = (pointer)&local_1c8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1c8,local_1e8,local_1e8 + local_1e0);
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"svrg","");
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_208,&local_259);
  local_100 = true;
  local_228[0] = local_218;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_228,"Streaming Stochastic Variance Reduced Gradient","");
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  this = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                   (&local_1c8,(typed_option<bool> *)local_170);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"stage_size","");
  VW::config::typed_option<int>::typed_option(&local_d0,&local_248,&location->stage_size);
  op = VW::config::typed_option<int>::default_value(&local_d0,1);
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_190,"Number of passes per SVRG stage","");
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<int>&>(this,op);
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_00308688;
  if (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p);
  }
  if (local_228[0] != local_218) {
    operator_delete(local_228[0]);
  }
  local_170._0_8_ = &PTR__typed_option_00308c78;
  if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
  }
  if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_170);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_1c8);
  if (local_259 == false) {
    plVar1 = (learner<SVRG::svrg,_example> *)0x0;
  }
  else {
    location->all = all;
    location->prev_pass = -1;
    location->stable_grad_count = 0;
    if ((all->weights).sparse == true) {
      sparse_parameters::stride_shift(&(all->weights).sparse_weights,2);
      puVar3 = &(all->weights).dense_weights._stride_shift;
      if (((all->weights).sparse & 1U) != 0) {
        puVar3 = &(all->weights).sparse_weights._stride_shift;
      }
      bVar2 = (byte)*puVar3;
    }
    else {
      (all->weights).dense_weights._stride_shift = 2;
      bVar2 = 2;
    }
    plVar1 = LEARNER::init_learner<SVRG::svrg,example,LEARNER::learner<char,example>>
                       (&local_258,SVRG::learn,SVRG::predict,1L << (bVar2 & 0x3f));
    *(code **)(plVar1 + 0x80) = SVRG::save_load;
    *(undefined8 *)(plVar1 + 0x70) = *(undefined8 *)(plVar1 + 0x18);
    *(undefined8 *)(plVar1 + 0x78) = *(undefined8 *)(plVar1 + 0x20);
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_1c8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_name._M_dataplus._M_p != &local_1c8.m_name.field_2) {
    operator_delete(local_1c8.m_name._M_dataplus._M_p);
  }
  if (local_258._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
      super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl != (svrg *)0x0) {
    (*(code *)local_258._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
              super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
              super__Tuple_impl<1UL,_void_(*)(void_*)>.
              super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl)
              (local_258._M_t.super___uniq_ptr_impl<SVRG::svrg,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_SVRG::svrg_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_SVRG::svrg_*,_false>._M_head_impl);
  }
  return (base_learner *)plVar1;
}

Assistant:

base_learner* svrg_setup(options_i& options, vw& all)
{
  auto s = scoped_calloc_or_throw<svrg>();

  bool svrg_option = false;
  option_group_definition new_options("Stochastic Variance Reduced Gradient");
  new_options.add(make_option("svrg", svrg_option).keep().help("Streaming Stochastic Variance Reduced Gradient"))
      .add(make_option("stage_size", s->stage_size).default_value(1).help("Number of passes per SVRG stage"));
  options.add_and_parse(new_options);

  if (!svrg_option)
  {
    return nullptr;
  }

  s->all = &all;
  s->prev_pass = -1;
  s->stable_grad_count = 0;

  // Request more parameter storage (4 floats per feature)
  all.weights.stride_shift(2);
  learner<svrg, example>& l = init_learner(s, learn, predict, UINT64_ONE << all.weights.stride_shift());
  l.set_save_load(save_load);
  return make_base(l);
}